

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O2

aom_codec_err_t
decoder_peek_si_internal
          (uint8_t *data,size_t data_sz,aom_codec_stream_info_t *si,int *is_intra_only)

{
  aom_codec_err_t aVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined7 uVar11;
  int iVar12;
  uint8_t *puVar13;
  bool bVar14;
  int local_d0;
  int local_cc;
  size_t payload_size;
  int local_c0;
  undefined4 local_bc;
  size_t bytes_read;
  aom_codec_stream_info_t *local_b0;
  ulong local_a8;
  int *local_a0;
  uint *local_98;
  uint *local_90;
  uint8_t *local_88;
  aom_read_bit_buffer local_80;
  ObuHeader obu_header;
  
  if ((long)data_sz < 1) {
    return AOM_CODEC_INVALID_PARAM;
  }
  si->w = 0;
  si->h = 0;
  si->is_kf = 0;
  obu_header.has_extension = 0;
  obu_header.temporal_layer_id = 0;
  obu_header.spatial_layer_id = 0;
  obu_header._28_4_ = 0;
  obu_header.size = 0;
  obu_header.type = 0;
  obu_header._9_3_ = 0;
  obu_header.has_size_field = 0;
  payload_size = 0;
  bytes_read = 0;
  aVar1 = aom_read_obu_header_and_size
                    (data,data_sz,si->is_annexb,&obu_header,&payload_size,&bytes_read);
  if (aVar1 != AOM_CODEC_OK) {
    return aVar1;
  }
  if (obu_header.type == OBU_TEMPORAL_DELIMITER) {
    uVar9 = payload_size + bytes_read;
    bVar14 = data_sz < uVar9;
    data_sz = data_sz - uVar9;
    if (bVar14) {
      return AOM_CODEC_CORRUPT_FRAME;
    }
    data = data + uVar9;
    aVar1 = aom_read_obu_header_and_size
                      (data,data_sz,si->is_annexb,&obu_header,&payload_size,&bytes_read);
    if (aVar1 != AOM_CODEC_OK) {
      return aVar1;
    }
  }
  local_90 = &si->number_spatial_layers;
  local_98 = &si->number_temporal_layers;
  local_c0 = 0;
  bVar14 = false;
  local_d0 = 0;
  local_b0 = si;
  local_a0 = is_intra_only;
  do {
    uVar9 = data_sz - bytes_read;
    if (uVar9 < payload_size) {
      return AOM_CODEC_CORRUPT_FRAME;
    }
    puVar13 = data + bytes_read;
    uVar10 = 0;
    iVar3 = local_d0;
    if ((obu_header.type == OBU_FRAME) || (obu_header.type == OBU_FRAME_HEADER)) {
      if ((bVar14) && ((char)local_c0 != '\0')) {
LAB_0016b6a8:
        local_b0->is_kf = 1;
        goto LAB_0016b6b4;
      }
      if (data_sz == bytes_read) {
        return AOM_CODEC_CORRUPT_FRAME;
      }
      local_80.bit_buffer_end = data + data_sz;
      local_80.bit_offset = 0;
      local_80.error_handler_data = (void *)0x0;
      local_80.error_handler = (aom_rb_error_handler)0x0;
      local_80.bit_buffer = puVar13;
      iVar2 = aom_rb_read_bit(&local_80);
      if (iVar2 == 0) {
        uVar6 = aom_rb_read_literal(&local_80,2);
        if ((uVar6 & 0xff) == 2) {
          iVar3 = 1;
        }
        if ((uVar6 & 0xff) == 0) {
          if (!bVar14) goto LAB_0016b6b4;
          goto LAB_0016b6a8;
        }
      }
    }
    else if (obu_header.type == OBU_SEQUENCE_HEADER) {
      if (uVar9 < 2) {
        return AOM_CODEC_CORRUPT_FRAME;
      }
      local_80.bit_buffer_end = data + data_sz;
      local_80.bit_offset = 0;
      local_80.error_handler_data = (void *)0x0;
      local_80.error_handler = (aom_rb_error_handler)0x0;
      local_88 = puVar13;
      local_80.bit_buffer = puVar13;
      av1_read_profile(&local_80);
      iVar2 = aom_rb_read_bit(&local_80);
      local_c0 = aom_rb_read_bit(&local_80);
      uVar11 = (undefined7)((ulong)uVar10 >> 8);
      if ((char)iVar2 == '\0' && (char)local_c0 != '\0') {
        return AOM_CODEC_UNSUP_BITSTREAM;
      }
      if ((char)local_c0 == '\0') {
        iVar2 = aom_rb_read_bit(&local_80);
        local_bc = (undefined4)CONCAT71(uVar11,1);
        local_a8 = uVar9;
        if ((char)iVar2 == '\0') {
          local_cc = 1;
        }
        else {
          uVar4 = aom_rb_read_unsigned_literal(&local_80,0x20);
          uVar5 = aom_rb_read_unsigned_literal(&local_80,0x20);
          if (uVar4 == 0) {
            return AOM_CODEC_UNSUP_BITSTREAM;
          }
          if (uVar5 == 0) {
            return AOM_CODEC_UNSUP_BITSTREAM;
          }
          iVar2 = aom_rb_read_bit(&local_80);
          if (((char)iVar2 != '\0') && (uVar4 = aom_rb_read_uvlc(&local_80), uVar4 == 0xffffffff)) {
            return AOM_CODEC_UNSUP_BITSTREAM;
          }
          iVar2 = aom_rb_read_bit(&local_80);
          local_cc = 1;
          if ((char)iVar2 != '\0') {
            local_cc = aom_rb_read_literal(&local_80,5);
            aom_rb_read_unsigned_literal(&local_80,0x20);
            aom_rb_read_literal(&local_80,5);
            aom_rb_read_literal(&local_80,5);
            local_cc = local_cc + 1;
            local_bc = 0;
          }
        }
        iVar8 = aom_rb_read_bit(&local_80);
        uVar6 = aom_rb_read_literal(&local_80,5);
        iVar2 = 0;
        for (iVar12 = 0; uVar9 = local_a8, (uVar6 & 0xff) + 1 != iVar12; iVar12 = iVar12 + 1) {
          iVar7 = aom_rb_read_literal(&local_80,0xc);
          if (iVar12 == 0) {
            iVar2 = iVar7;
          }
          iVar7 = aom_rb_read_literal(&local_80,5);
          if (7 < iVar7) {
            aom_rb_read_bit(&local_80);
          }
          if (((char)local_bc == '\0') && (iVar7 = aom_rb_read_bit(&local_80), (char)iVar7 != '\0'))
          {
            aom_rb_read_unsigned_literal(&local_80,local_cc);
            aom_rb_read_unsigned_literal(&local_80,local_cc);
            aom_rb_read_bit(&local_80);
          }
          if (((char)iVar8 != '\0') && (iVar7 = aom_rb_read_bit(&local_80), (char)iVar7 != '\0')) {
            aom_rb_read_literal(&local_80,4);
          }
        }
      }
      else {
        aom_rb_read_literal(&local_80,5);
        iVar2 = 0;
      }
      aVar1 = aom_get_num_layers_from_operating_point_idc(iVar2,local_90,local_98);
      if (aVar1 != AOM_CODEC_OK) {
        return AOM_CODEC_ERROR;
      }
      iVar2 = aom_rb_read_literal(&local_80,4);
      iVar8 = aom_rb_read_literal(&local_80,4);
      iVar2 = aom_rb_read_literal(&local_80,iVar2 + 1);
      iVar8 = aom_rb_read_literal(&local_80,iVar8 + 1);
      local_b0->w = iVar2 + 1;
      local_b0->h = iVar8 + 1;
      bVar14 = true;
      puVar13 = local_88;
    }
    local_d0 = iVar3;
    data_sz = uVar9 - payload_size;
    if (data_sz == 0) {
LAB_0016b6b4:
      if (local_a0 != (int *)0x0) {
        *local_a0 = local_d0;
        return AOM_CODEC_OK;
      }
      return AOM_CODEC_OK;
    }
    data = puVar13 + payload_size;
    aVar1 = aom_read_obu_header_and_size
                      (data,data_sz,local_b0->is_annexb,&obu_header,&payload_size,&bytes_read);
    if (aVar1 != AOM_CODEC_OK) {
      return aVar1;
    }
  } while( true );
}

Assistant:

static aom_codec_err_t decoder_peek_si_internal(const uint8_t *data,
                                                size_t data_sz,
                                                aom_codec_stream_info_t *si,
                                                int *is_intra_only) {
  int intra_only_flag = 0;
  int got_sequence_header = 0;
  int found_keyframe = 0;

  if (data + data_sz <= data || data_sz < 1) return AOM_CODEC_INVALID_PARAM;

  si->w = 0;
  si->h = 0;
  si->is_kf = 0;  // is_kf indicates whether the current packet contains a RAP

  ObuHeader obu_header;
  memset(&obu_header, 0, sizeof(obu_header));
  size_t payload_size = 0;
  size_t bytes_read = 0;
  uint8_t reduced_still_picture_hdr = 0;
  aom_codec_err_t status = aom_read_obu_header_and_size(
      data, data_sz, si->is_annexb, &obu_header, &payload_size, &bytes_read);
  if (status != AOM_CODEC_OK) return status;

  // If the first OBU is a temporal delimiter, skip over it and look at the next
  // OBU in the bitstream
  if (obu_header.type == OBU_TEMPORAL_DELIMITER) {
    // Skip any associated payload (there shouldn't be one, but just in case)
    if (data_sz < bytes_read + payload_size) return AOM_CODEC_CORRUPT_FRAME;
    data += bytes_read + payload_size;
    data_sz -= bytes_read + payload_size;

    status = aom_read_obu_header_and_size(
        data, data_sz, si->is_annexb, &obu_header, &payload_size, &bytes_read);
    if (status != AOM_CODEC_OK) return status;
  }
  while (1) {
    data += bytes_read;
    data_sz -= bytes_read;
    if (data_sz < payload_size) return AOM_CODEC_CORRUPT_FRAME;
    // Check that the selected OBU is a sequence header
    if (obu_header.type == OBU_SEQUENCE_HEADER) {
      // Sanity check on sequence header size
      if (data_sz < 2) return AOM_CODEC_CORRUPT_FRAME;
      // Read a few values from the sequence header payload
      struct aom_read_bit_buffer rb = { data, data + data_sz, 0, NULL, NULL };

      av1_read_profile(&rb);  // profile
      const uint8_t still_picture = aom_rb_read_bit(&rb);
      reduced_still_picture_hdr = aom_rb_read_bit(&rb);

      if (!still_picture && reduced_still_picture_hdr) {
        return AOM_CODEC_UNSUP_BITSTREAM;
      }

      status = parse_operating_points(&rb, reduced_still_picture_hdr, si);
      if (status != AOM_CODEC_OK) return status;

      int num_bits_width = aom_rb_read_literal(&rb, 4) + 1;
      int num_bits_height = aom_rb_read_literal(&rb, 4) + 1;
      int max_frame_width = aom_rb_read_literal(&rb, num_bits_width) + 1;
      int max_frame_height = aom_rb_read_literal(&rb, num_bits_height) + 1;
      si->w = max_frame_width;
      si->h = max_frame_height;
      got_sequence_header = 1;
    } else if (obu_header.type == OBU_FRAME_HEADER ||
               obu_header.type == OBU_FRAME) {
      if (got_sequence_header && reduced_still_picture_hdr) {
        found_keyframe = 1;
        break;
      } else {
        // make sure we have enough bits to get the frame type out
        if (data_sz < 1) return AOM_CODEC_CORRUPT_FRAME;
        struct aom_read_bit_buffer rb = { data, data + data_sz, 0, NULL, NULL };
        const int show_existing_frame = aom_rb_read_bit(&rb);
        if (!show_existing_frame) {
          const FRAME_TYPE frame_type = (FRAME_TYPE)aom_rb_read_literal(&rb, 2);
          if (frame_type == KEY_FRAME) {
            found_keyframe = 1;
            break;  // Stop here as no further OBUs will change the outcome.
          } else if (frame_type == INTRA_ONLY_FRAME) {
            intra_only_flag = 1;
          }
        }
      }
    }
    // skip past any unread OBU header data
    data += payload_size;
    data_sz -= payload_size;
    if (data_sz == 0) break;  // exit if we're out of OBUs
    status = aom_read_obu_header_and_size(
        data, data_sz, si->is_annexb, &obu_header, &payload_size, &bytes_read);
    if (status != AOM_CODEC_OK) return status;
  }
  if (got_sequence_header && found_keyframe) si->is_kf = 1;
  if (is_intra_only != NULL) *is_intra_only = intra_only_flag;
  return AOM_CODEC_OK;
}